

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Pipeline::MergePartialFromCodedStream(Pipeline *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  Rep *pRVar4;
  Arena *this_01;
  char *data;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  Type *this_02;
  pair<int,_int> pVar8;
  string *value;
  Type *pTVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  
  this_00 = &this->names_;
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b543f;
      input->buffer_ = pbVar2 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b543f:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar12 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar6 | uVar12;
    }
    uVar6 = (uint32)uVar12;
    if ((uVar12 & 0x100000000) == 0) {
LAB_003b54d0:
      iVar10 = 7;
      if ((uVar6 & 7) != 4 && uVar6 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
        goto LAB_003b54ef;
      }
    }
    else {
      uVar7 = (uint)(uVar12 >> 3) & 0x1fffffff;
      if (uVar7 != 2) {
        if ((uVar7 != 1) || ((char)uVar12 != '\n')) goto LAB_003b54d0;
        this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                            (&(this->models_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar11 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
          input->buffer_ = puVar3 + 1;
          bVar5 = true;
        }
        else {
          iVar11 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar5 = -1 < iVar11;
        }
        iVar10 = 6;
        if (bVar5) {
          pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar11);
          iVar10 = 6;
          if (-1 < (long)pVar8) {
            bVar5 = Model::MergePartialFromCodedStream(this_02,input);
            iVar10 = 6;
            if (bVar5) {
              bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                (input,pVar8.first);
              goto LAB_003b54ef;
            }
          }
        }
        goto LAB_003b54f8;
      }
      if ((char)uVar12 != '\x12') goto LAB_003b54d0;
      pRVar4 = (this->names_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar4 == (Rep *)0x0) {
LAB_003b5552:
        google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                  (&this_00->super_RepeatedPtrFieldBase,
                   (this->names_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_003b5562:
        pRVar4 = (this->names_).super_RepeatedPtrFieldBase.rep_;
        pRVar4->allocated_size = pRVar4->allocated_size + 1;
        this_01 = (this->names_).super_RepeatedPtrFieldBase.arena_;
        if (this_01 == (Arena *)0x0) {
          value = (string *)operator_new(0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
        }
        else {
          value = (string *)
                  google::protobuf::Arena::AllocateAligned
                            (this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
          google::protobuf::Arena::AddListNode
                    (this_01,value,
                     google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
        }
        pRVar4 = (this->names_).super_RepeatedPtrFieldBase.rep_;
        iVar11 = (this->names_).super_RepeatedPtrFieldBase.current_size_;
        (this->names_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
        pRVar4->elements[iVar11] = value;
      }
      else {
        iVar11 = (this->names_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar4->allocated_size <= iVar11) {
          if (pRVar4->allocated_size == (this->names_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_003b5552;
          goto LAB_003b5562;
        }
        (this->names_).super_RepeatedPtrFieldBase.current_size_ = iVar11 + 1;
        value = (string *)pRVar4->elements[iVar11];
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
      iVar10 = 6;
      if (bVar5) {
        pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->names_).super_RepeatedPtrFieldBase.current_size_ + -1);
        data = (pTVar9->_M_dataplus)._M_p;
        pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->names_).super_RepeatedPtrFieldBase.current_size_ + -1);
        bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (data,(int)pTVar9->_M_string_length,PARSE,
                           "CoreML.Specification.Pipeline.names");
LAB_003b54ef:
        iVar10 = 6;
        if (bVar5 != false) {
          iVar10 = 0;
        }
      }
    }
LAB_003b54f8:
    if (iVar10 != 0) {
      return iVar10 != 6;
    }
  } while( true );
}

Assistant:

bool Pipeline::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Pipeline)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.Model models = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_models()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string names = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_names()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->names(this->names_size() - 1).data(),
            this->names(this->names_size() - 1).length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Pipeline.names"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Pipeline)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Pipeline)
  return false;
#undef DO_
}